

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 jx9CompileVariable(jx9_gen_state *pGen,sxi32 iCompileFlag)

{
  SyToken *pSVar1;
  sxu32 sVar2;
  SyToken *pSVar3;
  sxi32 sVar4;
  SyHashEntry_Pr *pSVar5;
  char *pKey;
  sxi32 sVar6;
  
  pSVar3 = pGen->pIn;
  sVar2 = pSVar3->nLine;
  pSVar1 = pSVar3 + 1;
  pGen->pIn = pSVar1;
  if ((pSVar1 < pGen->pEnd) && ((pSVar3[1].nType & 0xc) != 0)) {
    pGen->pIn = pSVar3 + 2;
    sVar2 = pSVar3[1].sData.nByte;
    pSVar5 = (SyHashEntry_Pr *)0x0;
    if ((sVar2 != 0) && ((pGen->hVar).nEntry != 0)) {
      pSVar5 = HashGetEntry(&pGen->hVar,(pSVar1->sData).zString,sVar2);
    }
    if (pSVar5 == (SyHashEntry_Pr *)0x0) {
      pKey = SyMemBackendStrDup(&pGen->pVm->sAllocator,pSVar3[1].sData.zString,pSVar3[1].sData.nByte
                               );
      if (pKey == (char *)0x0) {
        jx9GenCompileError(pGen,1,1,"Fatal, Jx9 compiler is running out of memory");
        return -10;
      }
      SyHashInsert(&pGen->hVar,pKey,pSVar3[1].sData.nByte,pKey);
    }
    else {
      pKey = (char *)pSVar5->pUserData;
    }
    sVar6 = 0;
    jx9VmEmitInstr(pGen->pVm,3,(uint)((iCompileFlag & 3U) == 2),0,pKey,(sxu32 *)0x0);
  }
  else {
    sVar4 = jx9GenCompileError(pGen,1,sVar2,"Invalid variable name");
    sVar6 = 0;
    if (sVar4 == -10) {
      sVar6 = -10;
    }
  }
  return sVar6;
}

Assistant:

JX9_PRIVATE sxi32 jx9CompileVariable(jx9_gen_state *pGen,sxi32 iCompileFlag)
{
	sxu32 nLine = pGen->pIn->nLine;
	SyHashEntry *pEntry;
	SyString *pName;
	char *zName = 0;
	sxi32 iP1;
	void *p3;
	sxi32 rc;
	
	pGen->pIn++; /* Jump the dollar sign '$' */
	if( pGen->pIn >= pGen->pEnd || (pGen->pIn->nType & (JX9_TK_ID|JX9_TK_KEYWORD)) == 0 ){
		/* Invalid variable name */
		rc = jx9GenCompileError(pGen, E_ERROR, nLine, "Invalid variable name");
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
		return SXRET_OK;
	}
	/* Extract variable name */
	pName = &pGen->pIn->sData;
	/* Advance the stream cursor */
	pGen->pIn++;
	pEntry = SyHashGet(&pGen->hVar, (const void *)pName->zString, pName->nByte);
	if( pEntry == 0 ){
		/* Duplicate name */
		zName = SyMemBackendStrDup(&pGen->pVm->sAllocator, pName->zString, pName->nByte);
		if( zName == 0 ){
			return GenStateOutOfMem(pGen);
		}
		/* Install in the hashtable */
		SyHashInsert(&pGen->hVar, zName, pName->nByte, zName);
	}else{
		/* Name already available */
		zName = (char *)pEntry->pUserData;
	}
	p3 = (void *)zName;	
	iP1 = 0;
	if( iCompileFlag & EXPR_FLAG_RDONLY_LOAD ){
		if( (iCompileFlag & EXPR_FLAG_LOAD_IDX_STORE) == 0 ){
			/* Read-only load.In other words do not create the variable if inexistant */
			iP1 = 1;
		}
	}
	/* Emit the load instruction */
	jx9VmEmitInstr(pGen->pVm, JX9_OP_LOAD, iP1, 0, p3, 0);
	/* Node successfully compiled */
	return SXRET_OK;
}